

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

ParamGenerator<std::tuple<int,_aom_rc_mode,_int>_> __thiscall
testing::internal::CartesianProductHolder::operator_cast_to_ParamGenerator
          (CartesianProductHolder *this)

{
  ParamGeneratorInterface<std::tuple<int,_aom_rc_mode,_int>_> *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Tuple_impl<0UL,_testing::internal::ValueArray<unsigned_int>,_testing::internal::ValueArray<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
  *in_RSI;
  ParamGenerator<std::tuple<int,_aom_rc_mode,_int>_> PVar2;
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
  _Stack_48;
  
  __p = (ParamGeneratorInterface<std::tuple<int,_aom_rc_mode,_int>_> *)operator_new(0x38);
  std::
  _Tuple_impl<0ul,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<aom_rc_mode>,testing::internal::ParamGenerator<int>>
  ::
  _Tuple_impl<testing::internal::ValueArray<unsigned_int>,testing::internal::ValueArray<aom_rc_mode>,testing::internal::ParamGenerator<int>>
            ((_Tuple_impl<0ul,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<aom_rc_mode>,testing::internal::ParamGenerator<int>>
              *)&_Stack_48,in_RSI);
  __p->_vptr_ParamGeneratorInterface = (_func_int **)&PTR__CartesianProductGenerator_010425d8;
  std::
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
                 *)(__p + 1),&_Stack_48);
  *(ParamGeneratorInterface<std::tuple<int,_aom_rc_mode,_int>_> **)this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::internal::ParamGeneratorInterface<std::tuple<int,aom_rc_mode,int>>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
  _Var1._M_pi = extraout_RDX;
  if (_Stack_48.super__Head_base<0UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.
      impl_.
      super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (_Stack_48.super__Head_base<0UL,_testing::internal::ParamGenerator<int>,_false>.
               _M_head_impl.impl_.
               super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (_Stack_48.
      super__Tuple_impl<1UL,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
      .super__Head_base<1UL,_testing::internal::ParamGenerator<aom_rc_mode>,_false>._M_head_impl.
      impl_.
      super___shared_ptr<const_testing::internal::ParamGeneratorInterface<aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (_Stack_48.
               super__Tuple_impl<1UL,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
               .super__Head_base<1UL,_testing::internal::ParamGenerator<aom_rc_mode>,_false>.
               _M_head_impl.impl_.
               super___shared_ptr<const_testing::internal::ParamGeneratorInterface<aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  if (_Stack_48.
      super__Tuple_impl<1UL,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
      .super__Tuple_impl<2UL,_testing::internal::ParamGenerator<int>_>.
      super__Head_base<2UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.impl_.
      super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (_Stack_48.
               super__Tuple_impl<1UL,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
               .super__Tuple_impl<2UL,_testing::internal::ParamGenerator<int>_>.
               super__Head_base<2UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.
               impl_.
               super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_02;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_aom_rc_mode,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_aom_rc_mode,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<int,_aom_rc_mode,_int>_>)
         PVar2.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_aom_rc_mode,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<::std::tuple<T...>>() const {
    return ParamGenerator<::std::tuple<T...>>(
        new CartesianProductGenerator<T...>(generators_));
  }